

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

string_view __thiscall absl::lts_20250127::Cord::InlineRep::FindFlatStartPiece(InlineRep *this)

{
  string_view sVar1;
  string_view sVar2;
  string_view sVar3;
  byte bVar4;
  char *pcVar5;
  size_t sVar6;
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordRep *this_00;
  CordRepFlat *pCVar7;
  CordRepExternal *pCVar8;
  CordRepBtree *this_01;
  CordRepSubstring *pCVar9;
  uint uVar10;
  uint8_t *puVar11;
  size_t sVar12;
  string_view sVar13;
  
  if (((this->data_).rep_.field_0.data[0] & 1U) == 0) {
    pcVar5 = cord_internal::InlineData::as_chars(&this->data_);
    sVar6 = cord_internal::InlineData::Rep::inline_size((Rep *)this);
    sVar13._M_str = pcVar5;
    sVar13._M_len = sVar6;
    return sVar13;
  }
  rep = tree(this);
  this_00 = cord_internal::SkipCrcNode(rep);
  bVar4 = this_00->tag;
  if (bVar4 < 6) {
    if (bVar4 == 3) {
      this_01 = cord_internal::CordRep::btree(this_00);
      for (uVar10 = (uint)(this_01->super_CordRep).storage[0]; 0 < (int)uVar10; uVar10 = uVar10 - 1)
      {
        this_01 = cord_internal::CordRep::btree
                            (this_01->edges_[(this_01->super_CordRep).storage[1]]);
      }
      sVar13 = cord_internal::CordRepBtree::Data(this_01,(ulong)(this_01->super_CordRep).storage[1])
      ;
      return sVar13;
    }
    if (bVar4 != 5) {
      sVar6 = this_00->length;
      if (sVar6 == 0) {
        __assert_fail("length != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                      ,0x34b,"absl::string_view absl::Cord::InlineRep::FindFlatStartPiece() const");
      }
      if (bVar4 == 1) {
        pCVar9 = cord_internal::CordRep::substring(this_00);
        sVar12 = pCVar9->start;
        pCVar9 = cord_internal::CordRep::substring(this_00);
        this_00 = pCVar9->child;
        bVar4 = this_00->tag;
        if (5 < bVar4) {
          pCVar7 = cord_internal::CordRep::flat(this_00);
          sVar2._M_str = (char *)((pCVar7->super_CordRep).storage + sVar12);
          sVar2._M_len = sVar6;
          return sVar2;
        }
      }
      else {
        sVar12 = 0;
      }
      if (bVar4 == 5) {
        pCVar8 = cord_internal::CordRep::external(this_00);
        sVar3._M_str = pCVar8->base + sVar12;
        sVar3._M_len = sVar6;
        return sVar3;
      }
      __assert_fail("node->IsExternal() && \"Expect FLAT or EXTERNAL node here\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                    ,0x356,"absl::string_view absl::Cord::InlineRep::FindFlatStartPiece() const");
    }
    pCVar8 = cord_internal::CordRep::external(this_00);
    puVar11 = (uint8_t *)pCVar8->base;
  }
  else {
    pCVar7 = cord_internal::CordRep::flat(this_00);
    puVar11 = (pCVar7->super_CordRep).storage;
  }
  sVar1._M_str = (char *)puVar11;
  sVar1._M_len = this_00->length;
  return sVar1;
}

Assistant:

inline absl::string_view Cord::InlineRep::FindFlatStartPiece() const {
  if (!is_tree()) {
    return absl::string_view(data_.as_chars(), data_.inline_size());
  }

  CordRep* node = cord_internal::SkipCrcNode(tree());
  if (node->IsFlat()) {
    return absl::string_view(node->flat()->Data(), node->length);
  }

  if (node->IsExternal()) {
    return absl::string_view(node->external()->base, node->length);
  }

  if (node->IsBtree()) {
    CordRepBtree* tree = node->btree();
    int height = tree->height();
    while (--height >= 0) {
      tree = tree->Edge(CordRepBtree::kFront)->btree();
    }
    return tree->Data(tree->begin());
  }

  // Get the child node if we encounter a SUBSTRING.
  size_t offset = 0;
  size_t length = node->length;
  assert(length != 0);

  if (node->IsSubstring()) {
    offset = node->substring()->start;
    node = node->substring()->child;
  }

  if (node->IsFlat()) {
    return absl::string_view(node->flat()->Data() + offset, length);
  }

  assert(node->IsExternal() && "Expect FLAT or EXTERNAL node here");

  return absl::string_view(node->external()->base + offset, length);
}